

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

pointer __thiscall
QList<SubdirsMetaMakefileGenerator::Subdir_*>::data
          (QList<SubdirsMetaMakefileGenerator::Subdir_*> *this)

{
  detach(this);
  return (this->d).ptr;
}

Assistant:

pointer data() { detach(); return d->data(); }